

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  lua_State *L_local;
  
  luaL_register(L,"string",strlib);
  createmetatable(L);
  return 1;
}

Assistant:

static int luaopen_string(lua_State*L){
luaL_register(L,"string",strlib);
createmetatable(L);
return 1;
}